

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngasm.cpp
# Opt level: O1

void __thiscall
apngasm::APNGAsm::get_rect
          (APNGAsm *this,uint w,uint h,uchar *pimage1,uchar *pimage2,uchar *ptemp,uchar coltype,
          uint bpp,uint stride,int zbuf_size,uint has_tcolor,uint tcolor,int n)

{
  uint y;
  uint uVar1;
  uint uVar2;
  uint x;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  ushort uVar8;
  uint uVar9;
  uchar *puVar10;
  uchar *puVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  int h_00;
  byte *pbVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  uchar *pc;
  bool bVar19;
  bool bVar20;
  
  x = w - 1;
  y = h - 1;
  bVar20 = has_tcolor != 0;
  switch(bpp) {
  case 1:
    if (h != 0) {
      uVar2 = 0;
      iVar13 = 0;
      uVar14 = 0;
      uVar12 = 0;
      puVar10 = ptemp;
      puVar11 = pimage2;
      uVar18 = x;
      uVar6 = y;
      do {
        if (w != 0) {
          lVar7 = 0;
          do {
            bVar3 = puVar11[lVar7];
            if (pimage1[lVar7] == bVar3) {
              bVar3 = (byte)tcolor;
            }
            else {
              bVar19 = bVar20;
              if (bVar3 == tcolor) {
                bVar19 = false;
              }
              if (coltype != '\0') {
                bVar19 = bVar20;
              }
              if (has_tcolor == 0) {
                bVar19 = bVar20;
              }
              bVar20 = bVar19;
              if ((coltype == '\x03') && (this->_trns[bVar3] != 0xff)) {
                bVar20 = false;
              }
              iVar13 = iVar13 + 1;
              uVar17 = (uint)lVar7;
              bVar19 = uVar17 < x;
              x = uVar18;
              if (bVar19) {
                x = uVar17;
              }
              if (uVar12 < uVar17) {
                uVar12 = uVar17;
              }
              bVar19 = uVar2 < y;
              y = uVar6;
              if (bVar19) {
                y = uVar2;
              }
              uVar18 = x;
              uVar6 = y;
              if (uVar14 < uVar2) {
                uVar14 = uVar2;
              }
            }
            puVar10[lVar7] = bVar3;
            lVar7 = lVar7 + 1;
          } while (w != (uint)lVar7);
          pimage1 = pimage1 + (ulong)(w - 1) + 1;
          puVar10 = puVar10 + lVar7;
          puVar11 = puVar11 + lVar7;
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 != h);
      goto LAB_0013ba65;
    }
    break;
  case 2:
    if (h != 0) {
      uVar2 = 0;
      iVar13 = 0;
      uVar14 = 0;
      uVar12 = 0;
      puVar10 = ptemp;
      puVar11 = pimage2;
      do {
        if (w != 0) {
          lVar7 = 0;
          lVar16 = 0;
          do {
            uVar8 = *(ushort *)(puVar11 + lVar16 * 2);
            if ((*(ushort *)(pimage1 + lVar16 * 2) == uVar8) ||
               ((uVar8 | *(ushort *)(pimage1 + lVar16 * 2)) < 0x100)) {
              uVar8 = 0;
            }
            else {
              iVar13 = iVar13 + 1;
              if (uVar8 < 0xff00) {
                bVar20 = false;
              }
              uVar18 = (uint)lVar16;
              if (uVar18 < x) {
                x = uVar18;
              }
              if (uVar12 < uVar18) {
                uVar12 = uVar18;
              }
              if (uVar2 < y) {
                y = uVar2;
              }
              if (uVar14 < uVar2) {
                uVar14 = uVar2;
              }
            }
            *(ushort *)(puVar10 + lVar16 * 2) = uVar8;
            lVar16 = lVar16 + 1;
            lVar7 = lVar7 + -2;
          } while (w != (uint)lVar16);
          puVar10 = puVar10 + -lVar7;
          puVar11 = puVar11 + -lVar7;
          pimage1 = pimage1 + -lVar7;
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 != h);
      goto LAB_0013ba65;
    }
    break;
  case 3:
    if (h != 0) {
      uVar9 = 0;
      iVar13 = 0;
      uVar17 = 0;
      uVar14 = 0;
      uVar6 = 0;
      uVar12 = 0;
      pbVar15 = pimage2;
      puVar10 = ptemp;
      uVar2 = y;
      uVar18 = x;
      do {
        if (w != 0) {
          uVar1 = 0;
          do {
            uVar4 = (uint)*pbVar15 | (uint)pbVar15[1] << 8 | (uint)pbVar15[2] << 0x10;
            uVar5 = tcolor;
            if (((uint)*pimage1 | (uint)pimage1[1] << 8 | (uint)pimage1[2] << 0x10) != uVar4) {
              iVar13 = iVar13 + 1;
              bVar19 = bVar20;
              if (uVar4 == tcolor) {
                bVar19 = false;
              }
              if (has_tcolor != 0) {
                bVar20 = bVar19;
              }
              bVar19 = uVar1 < x;
              x = uVar18;
              if (bVar19) {
                x = uVar1;
              }
              bVar19 = uVar12 < uVar1;
              uVar12 = uVar6;
              if (bVar19) {
                uVar12 = uVar1;
              }
              bVar19 = uVar9 < y;
              y = uVar2;
              if (bVar19) {
                y = uVar9;
              }
              bVar19 = uVar14 < uVar9;
              uVar14 = uVar17;
              uVar5 = uVar4;
              uVar2 = y;
              uVar6 = uVar12;
              uVar18 = x;
              if (bVar19) {
                uVar14 = uVar9;
                uVar17 = uVar9;
              }
            }
            *(short *)puVar10 = (short)uVar5;
            puVar10[2] = (uchar)(uVar5 >> 0x10);
            pimage1 = pimage1 + 3;
            pbVar15 = pbVar15 + 3;
            puVar10 = puVar10 + 3;
            uVar1 = uVar1 + 1;
          } while (w != uVar1);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != h);
      goto LAB_0013ba65;
    }
    break;
  case 4:
    if (h != 0) {
      uVar2 = 0;
      iVar13 = 0;
      uVar14 = 0;
      uVar12 = 0;
      puVar10 = ptemp;
      puVar11 = pimage2;
      do {
        if (w != 0) {
          lVar16 = 0;
          lVar7 = 0;
          do {
            uVar18 = *(uint *)(puVar11 + lVar7 * 4);
            if ((*(uint *)(pimage1 + lVar7 * 4) == uVar18) ||
               ((*(uint *)(pimage1 + lVar7 * 4) | uVar18) < 0x1000000)) {
              uVar18 = 0;
            }
            else {
              iVar13 = iVar13 + 1;
              if (uVar18 < 0xff000000) {
                bVar20 = false;
              }
              uVar6 = (uint)lVar7;
              if (uVar6 < x) {
                x = uVar6;
              }
              if (uVar12 < uVar6) {
                uVar12 = uVar6;
              }
              if (uVar2 < y) {
                y = uVar2;
              }
              if (uVar14 < uVar2) {
                uVar14 = uVar2;
              }
            }
            *(uint *)(puVar10 + lVar7 * 4) = uVar18;
            lVar7 = lVar7 + 1;
            lVar16 = lVar16 + -4;
          } while (w != (uint)lVar7);
          puVar10 = puVar10 + -lVar16;
          puVar11 = puVar11 + -lVar16;
          pimage1 = pimage1 + -lVar16;
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 != h);
      goto LAB_0013ba65;
    }
  }
  uVar12 = 0;
  uVar14 = 0;
  iVar13 = 0;
LAB_0013ba65:
  if (iVar13 == 0) {
    iVar13 = 1;
    h_00 = 1;
    x = 0;
    y = 0;
  }
  else {
    iVar13 = (uVar12 - x) + 1;
    h_00 = (uVar14 - y) + 1;
  }
  deflate_rect_op(this,pimage2,x,y,iVar13,h_00,bpp,stride,zbuf_size,n * 2);
  if (bVar20) {
    deflate_rect_op(this,ptemp,x,y,iVar13,h_00,bpp,stride,zbuf_size,n * 2 | 1);
  }
  return;
}

Assistant:

void APNGAsm::get_rect(unsigned int w, unsigned int h, unsigned char *pimage1, unsigned char *pimage2, unsigned char *ptemp, unsigned char coltype, unsigned int bpp, unsigned int stride, int zbuf_size, unsigned int has_tcolor, unsigned int tcolor, int n)
  {
    unsigned int   i, j, x0, y0, w0, h0;
    unsigned int   x_min = w-1;
    unsigned int   y_min = h-1;
    unsigned int   x_max = 0;
    unsigned int   y_max = 0;
    unsigned int   diffnum = 0;
    unsigned int   over_is_possible = 1;

    if (!has_tcolor)
      over_is_possible = 0;

    if (bpp == 1)
    {
      unsigned char *pa = pimage1;
      unsigned char *pb = pimage2;
      unsigned char *pc = ptemp;

      for (j=0; j<h; j++)
      for (i=0; i<w; i++)
      {
        unsigned char c = *pb++;
        if (*pa++ != c)
        {
          diffnum++;
          if (coltype == 0 && has_tcolor && c == tcolor) over_is_possible = 0;
          if (coltype == 3 && _trns[c] != 0xFF) over_is_possible = 0;
          if (i<x_min) x_min = i;
          if (i>x_max) x_max = i;
          if (j<y_min) y_min = j;
          if (j>y_max) y_max = j;
        }
        else
          c = tcolor;

        *pc++ = c;
      }
    }
    else
    if (bpp == 2)
    {
      unsigned short *pa = (unsigned short *)pimage1;
      unsigned short *pb = (unsigned short *)pimage2;
      unsigned short *pc = (unsigned short *)ptemp;

      for (j=0; j<h; j++)
      for (i=0; i<w; i++)
      {
        unsigned int c1 = *pa++;
        unsigned int c2 = *pb++;
        if ((c1 != c2) && ((c1>>8) || (c2>>8)))
        {
          diffnum++;
          if ((c2 >> 8) != 0xFF) over_is_possible = 0;
          if (i<x_min) x_min = i;
          if (i>x_max) x_max = i;
          if (j<y_min) y_min = j;
          if (j>y_max) y_max = j;
        }
        else
          c2 = 0;

        *pc++ = c2;
      }
    }
    else
    if (bpp == 3)
    {
      unsigned char *pa = pimage1;
      unsigned char *pb = pimage2;
      unsigned char *pc = ptemp;

      for (j=0; j<h; j++)
      for (i=0; i<w; i++)
      {
        unsigned int c1 = (pa[2]<<16) + (pa[1]<<8) + pa[0];
        unsigned int c2 = (pb[2]<<16) + (pb[1]<<8) + pb[0];
        if (c1 != c2)
        {
          diffnum++;
          if (has_tcolor && c2 == tcolor) over_is_possible = 0;
          if (i<x_min) x_min = i;
          if (i>x_max) x_max = i;
          if (j<y_min) y_min = j;
          if (j>y_max) y_max = j;
        }
        else
          c2 = tcolor;

        memcpy(pc, &c2, 3);
        pa += 3;
        pb += 3;
        pc += 3;
      }
    }
    else
    if (bpp == 4)
    {
      unsigned int *pa = (unsigned int *)pimage1;
      unsigned int *pb = (unsigned int *)pimage2;
      unsigned int *pc = (unsigned int *)ptemp;

      for (j=0; j<h; j++)
      for (i=0; i<w; i++)
      {
        unsigned int c1 = *pa++;
        unsigned int c2 = *pb++;
        if ((c1 != c2) && ((c1>>24) || (c2>>24)))
        {
          diffnum++;
          if ((c2 >> 24) != 0xFF) over_is_possible = 0;
          if (i<x_min) x_min = i;
          if (i>x_max) x_max = i;
          if (j<y_min) y_min = j;
          if (j>y_max) y_max = j;
        }
        else
          c2 = 0;

        *pc++ = c2;
      }
    }

    if (diffnum == 0)
    {
      x0 = y0 = 0;
      w0 = h0 = 1;
    }
    else
    {
      x0 = x_min;
      y0 = y_min;
      w0 = x_max-x_min+1;
      h0 = y_max-y_min+1;
    }

    deflate_rect_op(pimage2, x0, y0, w0, h0, bpp, stride, zbuf_size, n*2);

    if (over_is_possible)
      deflate_rect_op(ptemp, x0, y0, w0, h0, bpp, stride, zbuf_size, n*2+1);
  }